

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

vm_obj_id_t CVmObjBigNum::create<32>(int in_root_set,bignum_t<32> *b)

{
  vm_obj_id_t vVar1;
  CVmObject *pCVar2;
  char *in_RSI;
  CVmObjBigNum *n;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffd8;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  CVmObjBigNum *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  
  vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffe0 >> 0x20),(int)in_stack_ffffffffffffffe0,
                    in_stack_ffffffffffffffdc);
  CVmObject::operator_new((size_t)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  CVmObjBigNum(in_stack_ffffffffffffffe0,
               CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  pCVar2 = vm_objp(0);
  copy_val(in_RSI,(char *)CONCAT44(vVar1,in_stack_ffffffffffffffe8),(int)((ulong)pCVar2 >> 0x20));
  return vVar1;
}

Assistant:

static vm_obj_id_t create(
        VMG_ int in_root_set, const bignum_t<prec> &b)
    {
        vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ prec);
        CVmObjBigNum *n = (CVmObjBigNum *)vm_objp(vmg_ id);
        copy_val(n->ext_, b.ext, FALSE);
        return id;
    }